

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall simplifyRational_rational2_Test::TestBody(simplifyRational_rational2_Test *this)

{
  char *message;
  ExprPtr EVar1;
  AssertionResult gtest_ar;
  ExprPtr f3o2;
  AssertHelper AStack_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  ExprPtr local_18;
  
  local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x200000003;
  *(undefined1 *)
   &local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 1;
  EVar1 = mathiu::impl::operator+((impl *)&AStack_58,&local_18,&local_18);
  mathiu::impl::toString_abi_cxx11_
            (&local_38,(impl *)&AStack_58,
             (ExprPtr *)
             EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            (local_48,"toString(f3o2 + f3o2)","\"3\"",&local_38,(char (*) [2])0x206bec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x71,message);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(simplifyRational, rational2)
{
    auto const f3o2 = fraction(3, 2);

    EXPECT_EQ(toString(f3o2 + f3o2), "3");
}